

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

StatusOr<unsigned_int> * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderList
          (StatusOr<unsigned_int> *__return_storage_ptr__,ProtoStreamObjectSource *this,Field *field
          ,StringPiece name,uint32 list_tag,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  undefined8 uVar3;
  uint32 uVar4;
  StringPiece local_78;
  undefined1 local_68 [8];
  Status _status;
  uint32 local_34;
  
  (*ow->_vptr_ObjectWriter[4])(ow,name.ptr_,name.length_);
  _status.error_message_.field_2._8_8_ = __return_storage_ptr__;
  if (((field->cardinality_ != 3) || (0xfffffffb < field->kind_ - 0xdU)) ||
     (field->number_ * 8 + 2U != list_tag)) {
    do {
      StringPiece::StringPiece(&local_78,"");
      (*(this->super_ObjectSource)._vptr_ObjectSource[6])
                (local_68,this,field,local_78.ptr_,local_78.length_,ow);
      __return_storage_ptr__ = (StatusOr<unsigned_int> *)_status.error_message_.field_2._8_8_;
      if (local_68._0_4_ != OK) {
        StatusOr<unsigned_int>::StatusOr
                  ((StatusOr<unsigned_int> *)_status.error_message_.field_2._8_8_,(Status *)local_68
                  );
        goto LAB_003342c3;
      }
      std::__cxx11::string::~string((string *)&_status);
      pCVar1 = this->stream_;
      pbVar2 = pCVar1->buffer_;
      if (pbVar2 < pCVar1->buffer_end_) {
        uVar4 = (uint32)*pbVar2;
        if ((char)*pbVar2 < '\0') goto LAB_0033429c;
        pCVar1->buffer_ = pbVar2 + 1;
      }
      else {
        uVar4 = 0;
LAB_0033429c:
        uVar4 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar4);
      }
      pCVar1->last_tag_ = uVar4;
      local_34 = uVar4;
    } while (uVar4 == list_tag);
    goto LAB_003342ee;
  }
  RenderPacked((Status *)local_68,this,field,ow);
  if (local_68._0_4_ != OK) {
    StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,(Status *)local_68);
LAB_003342c3:
    std::__cxx11::string::~string((string *)&_status);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)&_status);
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar4 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_003342de;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar4 = 0;
LAB_003342de:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar4);
  }
  pCVar1->last_tag_ = uVar4;
  local_34 = uVar4;
LAB_003342ee:
  (*ow->_vptr_ObjectWriter[5])();
  uVar3 = _status.error_message_.field_2._8_8_;
  StatusOr<unsigned_int>::StatusOr
            ((StatusOr<unsigned_int> *)_status.error_message_.field_2._8_8_,&local_34);
  return (StatusOr<unsigned_int> *)uVar3;
}

Assistant:

StatusOr<uint32> ProtoStreamObjectSource::RenderList(
    const google::protobuf::Field* field, StringPiece name,
    uint32 list_tag, ObjectWriter* ow) const {
  uint32 tag_to_return = 0;
  ow->StartList(name);
  if (IsPackable(*field) &&
      list_tag ==
          WireFormatLite::MakeTag(field->number(),
                                  WireFormatLite::WIRETYPE_LENGTH_DELIMITED)) {
    RETURN_IF_ERROR(RenderPacked(field, ow));
    // Since packed fields have a single tag, read another tag from stream to
    // return.
    tag_to_return = stream_->ReadTag();
  } else {
    do {
      RETURN_IF_ERROR(RenderField(field, "", ow));
    } while ((tag_to_return = stream_->ReadTag()) == list_tag);
  }
  ow->EndList();
  return tag_to_return;
}